

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O0

void stop_worker_thread(TRANSPORT_HANDLE_DATA *transportData)

{
  LOCK_RESULT LVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  TRANSPORT_HANDLE_DATA *transportData_local;
  
  LVar1 = Lock(transportData->lockHandle);
  if (LVar1 == LOCK_OK) {
    transportData->stopThread = 1;
    Unlock(transportData->lockHandle);
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                ,"stop_worker_thread",0x105,1,
                "Unable to lock - will still attempt to end thread without thread safety");
    }
    transportData->stopThread = 1;
  }
  return;
}

Assistant:

static void stop_worker_thread(TRANSPORT_HANDLE_DATA* transportData)
{
    if (Lock(transportData->lockHandle) != LOCK_OK)
    {
        // Need to setup a critical error function here to inform the user that an critical error
        // has occurred.
        LogError("Unable to lock - will still attempt to end thread without thread safety");
        transportData->stopThread = 1;
    }
    else
    {
        transportData->stopThread = 1;
        (void)Unlock(transportData->lockHandle);
    }

}